

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_4x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  char cVar1;
  code *pcVar2;
  code *pcVar3;
  uint uVar4;
  int8_t *piVar5;
  int iVar6;
  undefined7 in_register_00000009;
  long lVar7;
  int16_t *input_00;
  int fliplr;
  int flipud;
  int16_t *local_198;
  __m128i in [16];
  __m128i tmp [4];
  
  piVar5 = av1_fwd_txfm_shift_ls[0xd];
  uVar4 = (uint)CONCAT71(in_register_00000009,tx_type);
  pcVar2 = *(code **)((long)col_highbd_txfm8x16_arr + (ulong)(uVar4 * 8));
  iVar6 = 0;
  if (uVar4 < 0x10) {
    flipud = 1;
    fliplr = 0;
    if ((0x4110U >> (uVar4 & 0x1f) & 1) != 0) {
LAB_009ba804:
      input_00 = input + stride * 8;
      local_198 = input;
      goto LAB_009ba820;
    }
    if ((0x80a0U >> (uVar4 & 0x1f) & 1) == 0) {
      fliplr = flipud;
      if (uVar4 == 6) goto LAB_009ba804;
    }
    else {
      iVar6 = 1;
    }
  }
  fliplr = iVar6;
  local_198 = input + stride * 8;
  input_00 = input;
  flipud = 0;
LAB_009ba820:
  pcVar3 = *(code **)((long)row_highbd_txfm4x4_arr + (ulong)(uVar4 * 8));
  cVar1 = *av1_fwd_txfm_shift_ls[0xd];
  load_buffer_4x8(input_00,in,stride,flipud,fliplr,(int)cVar1);
  load_buffer_4x8(local_198,in + 8,stride,flipud,fliplr,(int)cVar1);
  (*pcVar2)(in,coeff,0xd,1);
  col_txfm_8x8_rounding((__m128i *)coeff,-(int)piVar5[1]);
  transpose_8nx8n((__m128i *)coeff,in,4,0x10);
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 0x10) {
    iVar6 = 4;
    (*pcVar3)((long)in[0] + lVar7,tmp,0xc);
    store_output_w4((int32_t *)((long)coeff + lVar7),tmp,0x10,iVar6);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_4x16_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[16];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X16];
  const int txw_idx = get_txw_idx(TX_4X16);
  const int txh_idx = get_txh_idx(TX_4X16);
  const int txfm_size_col = tx_size_wide[TX_4X16];
  const int txfm_size_row = tx_size_high[TX_4X16];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x16_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm4x4_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  // col transform
  load_buffer_4x16(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, outcoeff128, bitcol, 1);
  col_txfm_8x8_rounding(outcoeff128, -shift[1]);
  transpose_8nx8n(outcoeff128, in, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < 4; i++) {
    __m128i tmp[4];
    row_txfm(in + i, tmp, bitrow, txfm_size_row >> 2);
    store_output_w4(coeff + i * 4, tmp, txfm_size_row, txfm_size_col);
  }
  (void)bd;
}